

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcUtil.cpp
# Opt level: O2

string * XmlRpc::XmlRpcUtil::parseTag
                   (string *__return_storage_ptr__,char *tag,string *xml,int *offset)

{
  long lVar1;
  string etag;
  allocator<char> local_51;
  string local_50 [8];
  int local_48;
  
  if ((*offset < (int)xml->_M_string_length) &&
     (lVar1 = std::__cxx11::string::find((char *)xml,(ulong)tag), lVar1 != -1)) {
    strlen(tag);
    std::__cxx11::string::string<std::allocator<char>>(local_50,"</",&local_51);
    std::__cxx11::string::append((char *)local_50);
    lVar1 = std::__cxx11::string::find((string *)xml,(ulong)local_50);
    if (lVar1 == -1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      *offset = local_48 + (int)lVar1;
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)xml);
    }
    std::__cxx11::string::~string(local_50);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string 
XmlRpcUtil::parseTag(const char* tag, std::string const& xml, int* offset)
{
  if (*offset >= int(xml.length())) return std::string();
  size_t istart = xml.find(tag, *offset);
  if (istart == std::string::npos) return std::string();
  istart += strlen(tag);
  std::string etag = "</";
  etag += tag + 1;
  size_t iend = xml.find(etag, istart);
  if (iend == std::string::npos) return std::string();

  *offset = int(iend + etag.length());
  return xml.substr(istart, iend-istart);
}